

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBox::setMinimumContentsLength(QComboBox *this,int characters)

{
  long lVar1;
  QComboBoxPrivate *pQVar2;
  int in_ESI;
  QComboBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  QComboBoxPrivate *d;
  QSize local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QComboBox *)0x537e7e);
  if (((in_ESI != pQVar2->minimumContentsLength) && (-1 < in_ESI)) &&
     ((pQVar2->minimumContentsLength = in_ESI, pQVar2->sizeAdjustPolicy == AdjustToContents ||
      (pQVar2->sizeAdjustPolicy == AdjustToMinimumContentsLengthWithIcon)))) {
    QSize::QSize((QSize *)in_RDI);
    pQVar2->sizeHint = local_10;
    QComboBoxPrivate::adjustComboBoxSize(in_RDI);
    QWidget::updateGeometry((QWidget *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBox::setMinimumContentsLength(int characters)
{
    Q_D(QComboBox);
    if (characters == d->minimumContentsLength || characters < 0)
        return;

    d->minimumContentsLength = characters;

    if (d->sizeAdjustPolicy == AdjustToContents
        || d->sizeAdjustPolicy == AdjustToMinimumContentsLengthWithIcon) {
        d->sizeHint = QSize();
        d->adjustComboBoxSize();
        updateGeometry();
    }
}